

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

long __thiscall Omega_h::Read<long>::last(Read<long> *this)

{
  long lVar1;
  Read<signed_char> *this_local;
  ulong local_10;
  
  if (((ulong)(this->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((this->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(this->write_).shared_alloc_.alloc >> 3;
  }
  lVar1 = get(this,(int)(local_10 >> 3) + -1);
  return lVar1;
}

Assistant:

T Read<T>::last() const {
  return get(size() - 1);
}